

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEFilter<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  unsafe_unique_array<bool> *this;
  uint uVar1;
  undefined8 uVar2;
  RLEScanState<duckdb::uhugeint_t> *this_00;
  data_ptr_t pdVar3;
  pointer __p_00;
  InternalException *this_01;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  rle_count_t *index_pointer;
  data_ptr_t dataptr;
  ulong uVar11;
  idx_t iVar12;
  bool bVar13;
  data_ptr_t local_150;
  pointer __p;
  SelectionVector run_matches;
  SelectionVector matching_sel;
  Vector run_vector;
  LogicalType local_48;
  
  this_00 = (RLEScanState<duckdb::uhugeint_t> *)
            unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  pdVar3 = BufferHandle::Ptr(&this_00->handle);
  iVar12 = segment->offset;
  dataptr = pdVar3 + iVar12 + 8;
  uVar1 = this_00->rle_count_offset;
  if ((this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl == (bool *)0x0) {
    uVar10 = (ulong)uVar1 - 8 >> 4;
    this = &this_00->matching_runs;
    __p_00 = (pointer)operator_new__(uVar10);
    switchD_016d4fed::default(__p_00,0,uVar10);
    run_vector.vector_type = FLAT_VECTOR;
    run_vector._1_7_ = 0;
    ::std::__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>::reset
              ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_> *)this,__p_00);
    ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
              ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)&run_vector);
    switchD_016d4fed::default
              ((this->super_unique_ptr<bool[],_std::default_delete<bool[]>_>)._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,uVar10);
    LogicalType::LogicalType(&local_48,&result->type);
    Vector::Vector(&run_vector,&local_48,dataptr);
    LogicalType::~LogicalType(&local_48);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&matching_sel);
    Vector::ToUnifiedFormat(&run_vector,uVar10,(UnifiedVectorFormat *)&matching_sel);
    run_matches.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    run_matches.sel_vector = (sel_t *)0x0;
    run_matches.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_00->matching_run_count = uVar10;
    ColumnSegment::FilterSelection
              (&run_matches,&run_vector,(UnifiedVectorFormat *)&matching_sel,filter,filter_state,
               uVar10,&this_00->matching_run_count);
    iVar9 = this_00->matching_run_count;
    for (iVar4 = 0; iVar9 != iVar4; iVar4 = iVar4 + 1) {
      iVar6 = iVar4;
      if (run_matches.sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)run_matches.sel_vector[iVar4];
      }
      (this->super_unique_ptr<bool[],_std::default_delete<bool[]>_>)._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar6] = true;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&run_matches.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&matching_sel);
    Vector::~Vector(&run_vector);
  }
  if (this_00->matching_run_count == 0) {
    *sel_count = 0;
  }
  else {
    index_pointer = (rle_count_t *)(pdVar3 + uVar1 + iVar12);
    local_150 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector(&matching_sel,*sel_count);
    if (sel->sel_vector == (sel_t *)0x0) {
      uVar10 = *sel_count;
      uVar11 = 0;
      iVar12 = 0;
LAB_01a34154:
      uVar5 = uVar10 - uVar11;
      if (uVar11 <= uVar10 && uVar5 != 0) {
        iVar9 = this_00->entry_pos;
        iVar4 = this_00->position_in_entry;
        uVar7 = index_pointer[iVar9] - iVar4;
        pdVar3 = dataptr + iVar9 * 0x10;
        run_vector.vector_type = pdVar3[0];
        run_vector._1_1_ = pdVar3[1];
        run_vector._2_1_ = pdVar3[2];
        run_vector._3_1_ = pdVar3[3];
        run_vector._4_1_ = pdVar3[4];
        run_vector._5_1_ = pdVar3[5];
        run_vector._6_1_ = pdVar3[6];
        run_vector._7_1_ = pdVar3[7];
        run_vector.type.id_ = pdVar3[8];
        run_vector.type.physical_type_ = pdVar3[9];
        run_vector.type._2_1_ = pdVar3[10];
        run_vector.type._3_1_ = pdVar3[0xb];
        run_vector.type._4_1_ = pdVar3[0xc];
        run_vector.type._5_1_ = pdVar3[0xd];
        run_vector.type._6_1_ = pdVar3[0xe];
        run_vector.type._7_1_ = pdVar3[0xf];
        bVar13 = (this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
                 _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar9];
        if (uVar7 <= uVar5) goto code_r0x01a3418e;
        if (bVar13 != false) {
          local_150 = local_150 + uVar11 * 0x10;
          for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
            local_150[0] = run_vector.vector_type;
            local_150[1] = run_vector._1_1_;
            local_150[2] = run_vector._2_1_;
            local_150[3] = run_vector._3_1_;
            local_150[4] = run_vector._4_1_;
            local_150[5] = run_vector._5_1_;
            local_150[6] = run_vector._6_1_;
            local_150[7] = run_vector._7_1_;
            local_150[8] = run_vector.type.id_;
            local_150[9] = run_vector.type.physical_type_;
            local_150[10] = run_vector.type._2_1_;
            local_150[0xb] = run_vector.type._3_1_;
            local_150[0xc] = run_vector.type._4_1_;
            local_150[0xd] = run_vector.type._5_1_;
            local_150[0xe] = run_vector.type._6_1_;
            local_150[0xf] = run_vector.type._7_1_;
            matching_sel.sel_vector[iVar12] = (sel_t)uVar11;
            iVar12 = iVar12 + 1;
            local_150 = local_150 + 0x10;
          }
          iVar4 = this_00->position_in_entry;
        }
        this_00->position_in_entry = iVar4 + uVar5;
      }
      goto LAB_01a34113;
    }
    iVar12 = 0;
    uVar10 = 0;
    for (uVar11 = 0; uVar11 < *sel_count; uVar11 = uVar11 + 1) {
      uVar5 = uVar11;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)sel->sel_vector[uVar11];
      }
      if (uVar5 < uVar10) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&run_vector,
                   "Error in RLEFilter - selection vector indices are not ordered",
                   (allocator *)&run_matches);
        InternalException::InternalException(this_01,(string *)&run_vector);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      RLEScanState<duckdb::uhugeint_t>::SkipInternal(this_00,index_pointer,uVar5 - uVar10);
      if ((this_00->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[this_00->entry_pos] == true) {
        uVar2 = *(undefined8 *)(dataptr + this_00->entry_pos * 0x10 + 8);
        *(undefined8 *)(local_150 + uVar5 * 0x10) =
             *(undefined8 *)(dataptr + this_00->entry_pos * 0x10);
        *(undefined8 *)(local_150 + uVar5 * 0x10 + 8) = uVar2;
        matching_sel.sel_vector[iVar12] = (sel_t)uVar5;
        iVar12 = iVar12 + 1;
      }
      uVar10 = uVar5;
    }
    RLEScanState<duckdb::uhugeint_t>::SkipInternal(this_00,index_pointer,vector_count - uVar10);
LAB_01a34113:
    if (iVar12 != *sel_count) {
      SelectionVector::Initialize(sel,&matching_sel);
      *sel_count = iVar12;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&matching_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
code_r0x01a3418e:
  if (bVar13 != false) {
    pdVar3 = local_150 + uVar11 * 0x10;
    uVar8 = uVar11 & 0xffffffff;
    uVar5 = uVar7;
    while (bVar13 = uVar5 != 0, uVar5 = uVar5 - 1, bVar13) {
      pdVar3[0] = run_vector.vector_type;
      pdVar3[1] = run_vector._1_1_;
      pdVar3[2] = run_vector._2_1_;
      pdVar3[3] = run_vector._3_1_;
      pdVar3[4] = run_vector._4_1_;
      pdVar3[5] = run_vector._5_1_;
      pdVar3[6] = run_vector._6_1_;
      pdVar3[7] = run_vector._7_1_;
      pdVar3[8] = run_vector.type.id_;
      pdVar3[9] = run_vector.type.physical_type_;
      pdVar3[10] = run_vector.type._2_1_;
      pdVar3[0xb] = run_vector.type._3_1_;
      pdVar3[0xc] = run_vector.type._4_1_;
      pdVar3[0xd] = run_vector.type._5_1_;
      pdVar3[0xe] = run_vector.type._6_1_;
      pdVar3[0xf] = run_vector.type._7_1_;
      matching_sel.sel_vector[iVar12] = (sel_t)uVar8;
      iVar12 = iVar12 + 1;
      uVar8 = (ulong)((sel_t)uVar8 + 1);
      pdVar3 = pdVar3 + 0x10;
    }
    iVar9 = this_00->entry_pos;
  }
  uVar11 = uVar11 + uVar7;
  this_00->entry_pos = iVar9 + 1;
  this_00->position_in_entry = 0;
  goto LAB_01a34154;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}